

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.hpp
# Opt level: O0

void __thiscall Bezier<3,_2>::derivativePrecompute(Bezier<3,_2> *this)

{
  ColXpr local_118;
  ColXpr local_e8;
  ColXpr local_b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>
  local_88;
  int local_1c;
  int local_18;
  int i;
  int I_range;
  int k;
  Bezier<3,_2> *this_local;
  
  this->derivative_precal_prefix_[0] = 1;
  this->derivative_precal_prefix_[1] = 3;
  _I_range = this;
  for (i = 1; i < 4; i = i + 1) {
    local_18 = 3 - i;
    for (local_1c = 0; local_1c <= local_18; local_1c = local_1c + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::col
                (&local_b8,
                 (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)
                 (this->derivative_precal_points_ + (i + -1)),(long)(local_1c + 1));
      Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::col
                (&local_e8,
                 (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)
                 (this->derivative_precal_points_ + (i + -1)),(long)local_1c);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>>::operator-
                (&local_88,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>> *)&local_b8,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_> *)
                 &local_e8);
      Eigen::DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_>::col
                (&local_118,
                 (DenseBase<Eigen::Matrix<double,_2,_4,_0,_2,_4>_> *)
                 (this->derivative_precal_points_ + i),(long)local_1c);
      Eigen::Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true>::operator=
                ((Block<Eigen::Matrix<double,2,4,0,2,4>,2,1,true> *)&local_118,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,_2,_4,_0,_2,_4>,_2,_1,_true>_>_>
                  *)&local_88);
    }
    this->derivative_precal_prefix_[i] = this->derivative_precal_prefix_[i + -1] * (4 - i);
  }
  return;
}

Assistant:

void derivativePrecompute() {
    derivative_precal_prefix_[0] = 1;
    derivative_precal_prefix_[1] = N;
    for (int k = 1; k <= N; ++k) {
      int I_range = N - k;
      for (int i = 0; i <= I_range; ++i) {
        derivative_precal_points_[k].col(i) =
            derivative_precal_points_[k - 1].col(i + 1) - derivative_precal_points_[k - 1].col(i);
      }

      derivative_precal_prefix_[k] = derivative_precal_prefix_[k - 1] * (N - k + 1);
    }
  }